

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O3

int __thiscall gdscpp::genDot(gdscpp *this,string *fileName)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  pointer pgVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  ulong *puVar9;
  FILE *pFVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  pointer pgVar14;
  ulong uVar15;
  string bashCmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fromSTR;
  string lineStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toSTR;
  ulong *local_120;
  char *local_118;
  ulong local_110;
  long lStack_108;
  FILE *local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char *local_b8;
  char *local_b0;
  char local_a8;
  undefined7 uStack_a7;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Generating Dot file:\"",0x15);
  local_58 = fileName;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(fileName->_M_dataplus)._M_p,fileName->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" file",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pgVar14 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
            super__Vector_impl_data._M_start;
  pgVar5 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pgVar5 != pgVar14) {
    pFVar10 = (FILE *)0x0;
    do {
      if (pgVar14[(long)pFVar10].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pgVar14[(long)pFVar10].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar12 = 0;
        local_100 = pFVar10;
        do {
          if (local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar4 = 0;
            uVar15 = 1;
            do {
              iVar2 = std::__cxx11::string::compare
                                ((string *)
                                 (local_f8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar4));
              if (iVar2 == 0) {
                iVar2 = std::__cxx11::string::compare
                                  ((string *)
                                   (local_78.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar4));
                if (iVar2 == 0) goto LAB_0011a799;
              }
              bVar1 = uVar15 < (ulong)((long)local_f8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_f8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar4 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar1);
            pgVar14 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_f8,&pgVar14[(long)pFVar10].name);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_78,
                      (value_type *)
                      (*(long *)&(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)pFVar10].SREF.
                                 super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl +
                       uVar12 * 0x78 + 8));
LAB_0011a799:
          pgVar14 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = uVar12 + 1;
          uVar4 = ((long)pgVar14[(long)pFVar10].SREF.
                         super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)pgVar14[(long)pFVar10].SREF.
                         super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
        } while (uVar12 <= uVar4 && uVar4 - uVar12 != 0);
        pgVar5 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pFVar10 = local_100;
      }
      pFVar10 = (FILE *)((long)pFVar10 + 1);
      uVar12 = ((long)pgVar5 - (long)pgVar14 >> 3) * -0x1084210842108421;
    } while (pFVar10 <= uVar12 && uVar12 - (long)pFVar10 != 0);
  }
  pFVar10 = fopen("foo.dot","w");
  local_b8 = &local_a8;
  local_b0 = (char *)0x0;
  local_a8 = '\0';
  std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)0x0,0x175378);
  local_100 = pFVar10;
  fputs(local_b8,pFVar10);
  if (local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 1;
    uVar12 = 0;
    do {
      std::operator+(&local_50,"\t",
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar12);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_88 = *plVar7;
        lStack_80 = plVar6[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar7;
        local_98 = (long *)*plVar6;
      }
      local_90 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,
                                  (ulong)local_78.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                         _M_dataplus._M_p);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_d8.field_2._M_allocated_capacity = *psVar8;
        local_d8.field_2._8_8_ = plVar6[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar8;
        local_d8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_d8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_110 = *puVar9;
        lStack_108 = plVar6[3];
        local_120 = &local_110;
      }
      else {
        local_110 = *puVar9;
        local_120 = (ulong *)*plVar6;
      }
      local_118 = (char *)plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_120);
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      fputs(local_b8,local_100);
      uVar12 = (ulong)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar12 < (ulong)((long)local_f8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_f8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x177e9e);
  pFVar10 = local_100;
  fputs(local_b8,local_100);
  fclose(pFVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dot file done.",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_118 = (char *)0x0;
  local_110 = local_110 & 0xffffffffffffff00;
  local_120 = &local_110;
  std::operator+(&local_d8,"dot -Tjpg foo.dot -o ",local_58);
  std::__cxx11::string::operator=((string *)&local_120,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  iVar2 = system((char *)local_120);
  if (iVar2 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bash command :\"",0xf)
    ;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_120,(long)local_118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" error.",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_120,0,local_118,0x1753ce);
    iVar2 = system((char *)local_120);
    iVar11 = 0;
    if (iVar2 != -1) goto LAB_0011ac3b;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bash command :\"",0xf)
    ;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_120,(long)local_118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" error.",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  std::ostream::put((char)poVar3);
  iVar11 = 1;
  std::ostream::flush();
LAB_0011ac3b:
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return iVar11;
}

Assistant:

int gdscpp::genDot(const std::string &fileName)
{
  cout << "Generating Dot file:\"" << fileName << "\" file" << endl;

  vector<string> fromSTR;
  vector<string> toSTR;

  bool foundSTR;
  for (int i = 0; i < this->STR.size(); i++) {
    for (int j = 0; j < this->STR[i].SREF.size(); j++) {
      foundSTR = true;
      for (unsigned int k = 0; k < fromSTR.size(); k++) {
        if (!fromSTR[k].compare(this->STR[i].name) &&
            !toSTR[k].compare(this->STR[i].SREF[j].name)) {
          foundSTR = false;
          break;
        }
      }
      if (foundSTR) {
        fromSTR.push_back(this->STR[i].name);
        toSTR.push_back(this->STR[i].SREF[j].name);
      }
    }
  }

  // ------------------------ creating dot file ------------------------

  FILE *dotFile;
  dotFile = fopen("foo.dot", "w");

  string lineStr;

  lineStr = "digraph GDStree {\n";
  fputs(lineStr.c_str(), dotFile);

  for (unsigned int i = 0; i < fromSTR.size(); i++) {
    lineStr = "\t" + fromSTR[i] + " -> " + toSTR[i] + ";\n";
    fputs(lineStr.c_str(), dotFile);
  }

  lineStr = "}";
  fputs(lineStr.c_str(), dotFile);

  fclose(dotFile);
  cout << "Dot file done." << endl;

  // ------------------------ executing dot script ------------------------
  string bashCmd;
  bashCmd = "dot -Tjpg foo.dot -o " + fileName;

  if (system(bashCmd.c_str()) == -1) {
    cout << "Bash command :\"" << bashCmd << "\" error." << endl;
    return 1;
  }

  bashCmd = "rm foo.dot";
  if (system(bashCmd.c_str()) == -1) {
    cout << "Bash command :\"" << bashCmd << "\" error." << endl;
    return 1;
  }

  return 0;
}